

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O3

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  float fVar18;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  double dVar19;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar21;
  undefined1 auVar20 [16];
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  undefined1 auVar25 [16];
  ulong local_168;
  ulong local_158;
  value_type local_b0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  if (1 < anchors->w) {
    uVar14 = (uint)anchors->w >> 1;
    iVar8 = in_pad->c / (int)uVar14;
    uVar2 = in_pad->w;
    local_98._0_4_ = (undefined4)stride;
    uVar3 = in_pad->h;
    local_98._4_4_ = local_98._0_4_;
    local_98._8_4_ = local_98._0_4_;
    local_98._12_4_ = local_98._0_4_;
    uVar9 = 5;
    local_158 = 0;
    do {
      if (0 < (int)uVar3) {
        lVar11 = local_158 * (long)iVar8;
        uVar1 = *(undefined8 *)((long)anchors->data + local_158 * 8);
        local_88._0_8_ = (undefined8)(float)uVar1;
        local_88._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
        local_168 = 0;
        do {
          if (0 < (int)uVar2) {
            local_78 = ZEXT416((uint)(float)(int)local_168);
            lVar12 = 0;
            uVar15 = 0;
            do {
              pvVar4 = in_pad->data;
              sVar5 = in_pad->elemsize;
              sVar6 = in_pad->cstep;
              if (iVar8 < 6) {
                iVar16 = 0;
                fVar23 = -3.4028235e+38;
              }
              else {
                pfVar10 = (float *)((long)pvVar4 +
                                   (uVar9 * sVar6 + (long)in_pad->w * local_168) * sVar5 + lVar12);
                uVar13 = 0;
                uVar17 = 0;
                fVar23 = -3.4028235e+38;
                do {
                  if (fVar23 < *pfVar10) {
                    uVar17 = uVar13 & 0xffffffff;
                    fVar23 = *pfVar10;
                  }
                  iVar16 = (int)uVar17;
                  uVar13 = uVar13 + 1;
                  pfVar10 = (float *)((long)pfVar10 + sVar6 * sVar5);
                } while (iVar8 - 5 != uVar13);
              }
              fVar18 = expf(-*(float *)((long)pvVar4 +
                                       uVar15 * 4 +
                                       sVar6 * (lVar11 + 4) * sVar5 +
                                       (long)in_pad->w * local_168 * sVar5));
              fVar23 = expf(-fVar23);
              auVar20._4_4_ = fVar23 + DAT_005140f0._4_4_;
              auVar20._0_4_ = fVar18 + (float)DAT_005140f0;
              auVar20._8_4_ = extraout_XMM0_Db + DAT_005140f0._8_4_;
              auVar20._12_4_ = extraout_XMM0_Db_00 + DAT_005140f0._12_4_;
              auVar20 = divps(_DAT_005140f0,auVar20);
              fVar23 = auVar20._4_4_ * auVar20._0_4_;
              if (0.25 <= fVar23) {
                local_48 = expf(-*(float *)((long)pvVar4 +
                                           uVar15 * 4 +
                                           (long)in_pad->w * local_168 * sVar5 +
                                           sVar6 * lVar11 * sVar5));
                sVar5 = in_pad->cstep;
                pvVar4 = in_pad->data;
                sVar6 = in_pad->elemsize;
                fStack_44 = extraout_XMM0_Db_01;
                local_58 = expf(-*(float *)((long)pvVar4 +
                                           uVar15 * 4 +
                                           (long)in_pad->w * local_168 * sVar6 +
                                           sVar5 * (lVar11 + 1) * sVar6));
                fStack_54 = extraout_XMM0_Db_02;
                local_68 = expf(-*(float *)((long)pvVar4 +
                                           uVar15 * 4 +
                                           (long)in_pad->w * local_168 * sVar6 +
                                           sVar5 * (lVar11 + 2) * sVar6));
                fStack_64 = extraout_XMM0_Db_03;
                fVar18 = expf(-*(float *)((long)pvVar4 +
                                         uVar15 * 4 +
                                         (long)in_pad->w * local_168 * sVar6 +
                                         sVar5 * (lVar11 + 3) * sVar6));
                auVar25._4_4_ = local_58 + DAT_005140f0._4_4_;
                auVar25._0_4_ = local_48 + (float)DAT_005140f0;
                auVar25._8_4_ = fStack_44 + DAT_005140f0._8_4_;
                auVar25._12_4_ = fStack_54 + DAT_005140f0._12_4_;
                auVar25 = divps(_DAT_005140f0,auVar25);
                auVar7._4_4_ = fVar18 + DAT_005140f0._4_4_;
                auVar7._0_4_ = local_68 + (float)DAT_005140f0;
                auVar7._8_4_ = fStack_64 + DAT_005140f0._8_4_;
                auVar7._12_4_ = extraout_XMM0_Db_04 + DAT_005140f0._12_4_;
                auVar20 = divps(_DAT_005140f0,auVar7);
                fVar24 = (auVar25._0_4_ + auVar25._0_4_ + -0.5 + (float)(int)uVar15) *
                         (float)local_98._0_4_;
                fVar26 = (auVar25._4_4_ + auVar25._4_4_ + -0.5 + (float)local_78._0_4_) *
                         (float)local_98._4_4_;
                dVar19 = (double)(auVar20._0_4_ + auVar20._0_4_);
                dVar22 = (double)(auVar20._4_4_ + auVar20._4_4_);
                fVar18 = (float)(dVar19 * dVar19 * (double)local_88._0_8_) * 0.5;
                fVar21 = (float)(dVar22 * dVar22 * (double)local_88._8_8_) * 0.5;
                local_b0.rect.x = fVar24 - fVar18;
                local_b0.rect.y = fVar26 - fVar21;
                local_b0.rect.width = (fVar18 + fVar24) - local_b0.rect.x;
                local_b0.rect.height = (fVar21 + fVar26) - local_b0.rect.y;
                local_b0.label = iVar16;
                local_b0.prob = fVar23;
                std::vector<Object,_std::allocator<Object>_>::push_back
                          ((vector<Object,_std::allocator<Object>_> *)feat_blob,&local_b0);
              }
              uVar15 = uVar15 + 1;
              lVar12 = lVar12 + 4;
            } while (uVar15 != uVar2);
          }
          local_168 = local_168 + 1;
        } while (local_168 != uVar3);
      }
      local_158 = local_158 + 1;
      uVar9 = uVar9 + iVar8;
    } while (local_158 != uVar14);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = feat_blob.c / num_anchors - 5;

    const int feat_offset = num_class + 5;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * feat_offset + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * feat_offset + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * feat_offset + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * feat_offset + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * feat_offset + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * feat_offset + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}